

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *
Catch::Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
          (void)

{
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar1;
  ISingleton *unaff_RBX;
  
  if (getInternal::s_instance ==
      (Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *)0x0) {
    pSVar1 = (Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *)
             operator_new(0x1b0);
    (pSVar1->super_StringStreams).m_streams.
    super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar1->super_StringStreams).m_streams.
    super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar1->super_StringStreams).m_streams.
    super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pSVar1->super_StringStreams).m_unused.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar1->super_StringStreams).m_unused.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar1->super_StringStreams).m_unused.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)&(pSVar1->super_StringStreams).m_referenceStream);
    (pSVar1->super_ISingleton)._vptr_ISingleton = (_func_int **)&PTR__Singleton_001bd808;
    getInternal::s_instance = pSVar1;
    addSingleton(unaff_RBX);
  }
  return getInternal::s_instance;
}

Assistant:

static auto getInternal() -> Singleton* {
            static Singleton* s_instance = nullptr;
            if( !s_instance ) {
                s_instance = new Singleton;
                addSingleton( s_instance );
            }
            return s_instance;
        }